

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmvmesh.cpp
# Opt level: O1

void __thiscall TPZMVGraphMesh::DrawMesh(TPZMVGraphMesh *this,int numcases)

{
  ofstream *this_00;
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  
  this->fNumCases = numcases;
  this->fNumSteps = 0;
  this_00 = &(this->super_TPZGraphMesh).fOutFile;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"%HEADER",7);
  cVar1 = (char)this_00;
  std::ios::widen((char)*(undefined8 *)(*(long *)&(this->super_TPZGraphMesh).fOutFile + -0x18) +
                  cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Arquivo gerado por PZ",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)&(this->super_TPZGraphMesh).fOutFile + -0x18) +
                  cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"%RESULT\n1",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)&(this->super_TPZGraphMesh).fOutFile + -0x18) +
                  cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar2 = (ostream *)std::ostream::operator<<(this_00,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," \'Caso Unico\'",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"%RESULT.CASE",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)&(this->super_TPZGraphMesh).fOutFile + -0x18) +
                  cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar2 = (ostream *)std::ostream::operator<<(this_00,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  plVar3 = (long *)std::ostream::operator<<(poVar2,numcases);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (0 < numcases) {
    iVar4 = 0;
    do {
      iVar5 = iVar4 + 1;
      poVar2 = (ostream *)std::ostream::operator<<(this_00,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," \'step",6);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      iVar4 = iVar5;
    } while (numcases != iVar5);
  }
  (*(this->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable[10])(this);
  (*(this->super_TPZGraphMesh).super_TPZSavable._vptr_TPZSavable[0xc])(this,7);
  return;
}

Assistant:

void TPZMVGraphMesh::DrawMesh(int numcases) {
	
	fNumCases = numcases;
	fNumSteps = 0;
	(fOutFile) << "%HEADER" << endl;
	(fOutFile) << "Arquivo gerado por PZ" << endl;
	(fOutFile) << "%RESULT\n1" << endl;
	(fOutFile) << 1 << " 'Caso Unico'" << endl;
	(fOutFile) << "%RESULT.CASE" << endl;
	(fOutFile) << 1 << " " << numcases << endl;
	for(int i=0; i<numcases;i++) {
		(fOutFile) << (i+1) << " 'step" << i << "'" << endl;
	}
	DrawNodes();
	DrawConnectivity(ECube);
}